

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_read_start_siblings(lylyb_ctx *lybctx)

{
  long local_40;
  uint64_t local_30;
  long *local_28;
  char *p__;
  uint64_t u;
  lylyb_ctx *lybctx_local;
  
  if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = *(uint64_t *)&lybctx->siblings[-1].inner_chunks;
  }
  if (local_30 == lybctx->sibling_size) {
    if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
      local_28 = (long *)calloc(1,(local_30 + 4) * 0x18 + 8);
      if (local_28 == (long *)0x0) {
        ly_log(lybctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyb_read_start_siblings");
        return LY_EMEM;
      }
    }
    else {
      local_28 = (long *)realloc(&lybctx->siblings[-1].inner_chunks,
                                 (*(long *)&lybctx->siblings[-1].inner_chunks + local_30 + 4) * 0x18
                                 + 8);
      if (local_28 == (long *)0x0) {
        ly_log(lybctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyb_read_start_siblings");
        return LY_EMEM;
      }
    }
    lybctx->siblings = (lyd_lyb_sibling *)(local_28 + 1);
    if (lybctx->siblings != (lyd_lyb_sibling *)0x0) {
      memset(lybctx->siblings + *local_28,0,(local_30 + 4) * 0x18);
    }
    lybctx->sibling_size = local_30 + 4;
  }
  *(long *)&lybctx->siblings[-1].inner_chunks = *(long *)&lybctx->siblings[-1].inner_chunks + 1;
  if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = *(long *)&lybctx->siblings[-1].inner_chunks;
  }
  lyb_read_sibling_meta(lybctx->siblings + local_40 + -1,lybctx);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_read_start_siblings(struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;

    u = LY_ARRAY_COUNT(lybctx->siblings);
    if (u == lybctx->sibling_size) {
        LY_ARRAY_CREATE_RET(lybctx->ctx, lybctx->siblings, u + LYB_SIBLING_STEP, LY_EMEM);
        lybctx->sibling_size = u + LYB_SIBLING_STEP;
    }

    LY_ARRAY_INCREMENT(lybctx->siblings);
    lyb_read_sibling_meta(&LYB_LAST_SIBLING(lybctx), lybctx);

    return LY_SUCCESS;
}